

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_ConvertToRgb
          (ConvertToRgbForm2 ConvertToRgb,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  code *in_RDI;
  uint32_t i;
  TimerContainer timer;
  Image output;
  Image input;
  Image *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint uVar2;
  uint local_d4;
  undefined1 local_b0 [16];
  BaseTimerContainer *in_stack_ffffffffffffff60;
  undefined1 local_50 [56];
  code *local_18;
  pair<double,_double> local_10;
  
  local_18 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,(uint8_t)((ulong)in_stack_ffffffffffffff00 >> 0x38)
             ,(uint8_t)((ulong)in_stack_ffffffffffffff00 >> 0x30));
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x17322f);
  Test_Helper::uniformRGBImage
            ((uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08);
  SetupFunction((string *)0x173251);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)in_stack_ffffffffffffff00);
  local_d4 = 0;
  while( true ) {
    uVar2 = local_d4;
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)in_stack_ffffffffffffff00);
    (*local_18)(local_50,local_b0);
    Performance_Test::TimerContainer::stop
              ((TimerContainer *)CONCAT44(uVar2,in_stack_ffffffffffffff10));
    local_d4 = local_d4 + 1;
  }
  CleanupFunction((string *)0x173352);
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff60);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x173394);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x17339e);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1733ab);
  return local_10;
}

Assistant:

std::pair < double, double > template_ConvertToRgb( ConvertToRgbForm2 ConvertToRgb, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image input  = Performance_Test::uniformImage   ( size, size );
        PenguinV_Image::Image output = Performance_Test::uniformRGBImage( size, size );

        TEST_FUNCTION_LOOP( ConvertToRgb( input, output ), namespaceName )
    }